

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

istream * __thiscall nivalis::Expr::from_bin(Expr *this,istream *is)

{
  pointer pAVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  util::
  resize_from_read_bin<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>
            (is,&this->ast);
  lVar3 = 0;
  for (uVar2 = 0;
      pAVar1 = (this->ast).
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->ast).
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4);
      uVar2 = uVar2 + 1) {
    util::read_bin<nivalis::Expr::ASTNode>(is,(ASTNode *)((long)&pAVar1->opcode + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  return is;
}

Assistant:

std::istream& Expr::from_bin(std::istream& is) {
    util::resize_from_read_bin(is, ast);
    for (size_t i = 0; i < ast.size(); ++i) {
        util::read_bin(is, ast[i]);
    }
    return is;
}